

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::insertToolBar(QMainWindowLayout *this,QToolBar *before,QToolBar *toolbar)

{
  QArrayDataPointer<int> *this_00;
  QLayoutItem *item;
  long in_FS_OFFSET;
  QRect QVar1;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::addChildWidget((QLayout *)this,&toolbar->super_QWidget);
  item = QToolBarAreaLayout::insertToolBar((QToolBarAreaLayout *)(this + 0xa0),before,toolbar);
  if (((item != (QLayoutItem *)0x0) && (*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8))) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QToolBarAreaLayout::insertItem((QToolBarAreaLayout *)(this + 0x3d8),before,item);
  }
  if ((*(long *)(this + 0x7c0) != 0) && (**(int **)(this + 0x7b8) == 0)) {
    this_00 = (QArrayDataPointer<int> *)(this + 0x7b0);
    QToolBarAreaLayout::currentGapIndex((QList<int> *)&local_40,(QToolBarAreaLayout *)(this + 0xa0))
    ;
    QArrayDataPointer<int>::operator=(this_00,&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    if (*(long *)(this + 0x7c0) != 0) {
      QList<int>::prepend((QList<int> *)this_00,0);
      QVar1 = QMainWindowLayoutState::itemRect
                        ((QMainWindowLayoutState *)(this + 0x88),(QList<int> *)this_00);
      *(QRect *)(this + 0x7c8) = QVar1;
    }
  }
  (**(code **)(*(long *)this + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::insertToolBar(QToolBar *before, QToolBar *toolbar)
{
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.insertToolBar(before, toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(before, item);
    }
    if (!currentGapPos.isEmpty() && currentGapPos.constFirst() == 0) {
        currentGapPos = layoutState.toolBarAreaLayout.currentGapIndex();
        if (!currentGapPos.isEmpty()) {
            currentGapPos.prepend(0);
            currentGapRect = layoutState.itemRect(currentGapPos);
        }
    }
    invalidate();
}